

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_column.h
# Opt level: O2

vector<bool,_std::allocator<bool>_> * __thiscall
Gudhi::persistence_matrix::
Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
::get_content(vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,
             Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
             *this,int columnLength)

{
  _Node_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_true,_true>
  _Var1;
  __node_base *p_Var2;
  reference rVar3;
  allocator_type local_1a;
  bool local_19;
  
  if (columnLength < 0) {
    if ((this->column_)._M_h._M_element_count == 0) {
      (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      return __return_storage_ptr__;
    }
    _Var1 = std::
            __max_element<std::__detail::_Node_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*,true,true>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::EntryPointerComp>>
                      ((this->column_)._M_h._M_before_begin._M_nxt,0);
    columnLength = *(int *)(*(long *)((long)_Var1.
                                            super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_true>
                                            ._M_cur + 8) + 0x18) + 1;
  }
  local_19 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,(long)columnLength,&local_19,&local_1a);
  p_Var2 = &(this->column_)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    if (*(uint *)&p_Var2[1]._M_nxt[3]._M_nxt < (uint)columnLength) {
      rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (__return_storage_ptr__,(ulong)*(uint *)&p_Var2[1]._M_nxt[3]._M_nxt);
      *rVar3._M_p = *rVar3._M_p | rVar3._M_mask;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<typename Unordered_set_column<Master_matrix>::Field_element>
Unordered_set_column<Master_matrix>::get_content(int columnLength) const
{
  if (columnLength < 0 && column_.size() > 0)
    columnLength = (*std::max_element(column_.begin(), column_.end(), EntryPointerComp()))->get_row_index() + 1;
  else if (columnLength < 0)
    return std::vector<Field_element>();

  std::vector<Field_element> container(columnLength, 0);
  for (auto it = column_.begin(); it != column_.end(); ++it) {
    if ((*it)->get_row_index() < static_cast<ID_index>(columnLength)) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        container[(*it)->get_row_index()] = 1;
      } else {
        container[(*it)->get_row_index()] = (*it)->get_element();
      }
    }
  }
  return container;
}